

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

bool __thiscall HEkk::lpFactorRowCompatible(HEkk *this)

{
  bool bVar1;
  
  bVar1 = lpFactorRowCompatible(this,(this->lp_).num_row_);
  return bVar1;
}

Assistant:

bool HEkk::lpFactorRowCompatible() const {
  return lpFactorRowCompatible(this->lp_.num_row_);
}